

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::initTest(TessellationShaderTCTEgl_TessLevel *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  ContextType CVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined1 local_128 [8];
  _test_descriptor test_tes_fo;
  _test_descriptor test_tes_fe;
  _test_descriptor test_tes_equal;
  _test_descriptor test_tcs_tes_fo;
  _test_descriptor test_tcs_tes_fe;
  _test_descriptor test_tcs_tes_equal;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTCTEgl_TessLevel *local_10;
  TessellationShaderTCTEgl_TessLevel *this_local;
  long lVar6;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xcb4);
  (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xcb7);
  (**(code **)(lVar6 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
             &this->m_gl_max_tess_gen_level_value);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_TESS_GEN_LEVEL_EXT pname failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xcbc);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tcs_tes_fe.inner_tess_levels_uniform_location);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tcs_tes_fo.inner_tess_levels_uniform_location);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tes_equal.inner_tess_levels_uniform_location);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tes_fe.inner_tess_levels_uniform_location);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)&test_tes_fo.inner_tess_levels_uniform_location);
  _test_descriptor::_test_descriptor((_test_descriptor *)local_128);
  initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,
                     (_test_descriptor *)&test_tcs_tes_fe.inner_tess_levels_uniform_location,
                     TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
  initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,
                     (_test_descriptor *)&test_tcs_tes_fo.inner_tess_levels_uniform_location,
                     TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
  initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,
                     (_test_descriptor *)&test_tes_equal.inner_tess_levels_uniform_location,
                     TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  CVar4.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(CVar4);
  if (!bVar1) {
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,
                       (_test_descriptor *)&test_tes_fe.inner_tess_levels_uniform_location,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,
                       (_test_descriptor *)&test_tes_fo.inner_tess_levels_uniform_location,
                       TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,(_test_descriptor *)local_128,
                       TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
  }
  std::
  vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
  ::push_back(&this->m_tests,(value_type *)&test_tcs_tes_fe.inner_tess_levels_uniform_location);
  std::
  vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
  ::push_back(&this->m_tests,(value_type *)&test_tcs_tes_fo.inner_tess_levels_uniform_location);
  std::
  vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
  ::push_back(&this->m_tests,(value_type *)&test_tes_equal.inner_tess_levels_uniform_location);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  CVar4.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(CVar4);
  if (!bVar1) {
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::push_back(&this->m_tests,(value_type *)&test_tes_fe.inner_tess_levels_uniform_location);
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::push_back(&this->m_tests,(value_type *)&test_tes_fo.inner_tess_levels_uniform_location);
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::push_back(&this->m_tests,(value_type *)local_128);
  }
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_bo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xce3);
  (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_bo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xce6);
  (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindBufferBase() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xce8);
  return;
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we carry on */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve gen level */
	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &m_gl_max_tess_gen_level_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_TESS_GEN_LEVEL_EXT pname failed");

	/* Initialize test descriptors */
	_test_descriptor test_tcs_tes_equal;
	_test_descriptor test_tcs_tes_fe;
	_test_descriptor test_tcs_tes_fo;
	_test_descriptor test_tes_equal;
	_test_descriptor test_tes_fe;
	_test_descriptor test_tes_fo;

	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_equal, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_fe,
					   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_fo,
					   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_equal, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_fe,
						   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_fo, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
	}

	m_tests.push_back(test_tcs_tes_equal);
	m_tests.push_back(test_tcs_tes_fe);
	m_tests.push_back(test_tcs_tes_fo);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_tests.push_back(test_tes_equal);
		m_tests.push_back(test_tes_fe);
		m_tests.push_back(test_tes_fo);
	}

	/* Generate and set up a buffer object we will use to hold XFBed data.
	 *
	 * NOTE: We do not set the buffer object's storage here because its size
	 *       is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* We're good to execute the test! */
}